

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cpp
# Opt level: O0

bool __thiscall
Volume::Intersect(Volume *this,Ray *ray,float t_min,float t_max,hit_record_t *hit_record)

{
  long *plVar1;
  undefined8 uVar2;
  byte bVar3;
  float *pfVar4;
  float *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  float fVar5;
  float fVar6;
  float fVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float _hit_distance;
  float _distance_in_object;
  hit_record_t _hit_record_2;
  hit_record_t _hit_record_1;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  float fVar11;
  float in_stack_fffffffffffffed0;
  float in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  float t;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 uVar12;
  Vec3 local_d0;
  Vec3 local_c4;
  Vec3 local_b8;
  float local_ac;
  Vec3 local_a8;
  float local_9c;
  undefined4 local_98;
  float local_88 [12];
  float local_58 [12];
  float *local_28;
  float local_20;
  float local_1c;
  undefined8 local_18;
  byte local_1;
  undefined8 extraout_XMM0_Qb;
  
  local_28 = in_RDX;
  local_18 = in_RSI;
  hit_record_t::hit_record_t
            ((hit_record_t *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  hit_record_t::hit_record_t
            ((hit_record_t *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  uVar2 = local_18;
  plVar1 = *(long **)(in_RDI + 8);
  std::numeric_limits<float>::max();
  std::numeric_limits<float>::max();
  bVar3 = (**(code **)(*plVar1 + 0x10))(plVar1,uVar2,local_58);
  if ((bVar3 & 1) != 0) {
    plVar1 = *(long **)(in_RDI + 8);
    fVar5 = local_58[0] + 0.0001;
    std::numeric_limits<float>::max();
    bVar3 = (**(code **)(*plVar1 + 0x10))(plVar1,local_18,local_88);
    t = (float)((ulong)local_18 >> 0x20);
    uVar12 = CONCAT13(bVar3,(int3)in_stack_ffffffffffffff0c);
    if ((bVar3 & 1) != 0) {
      pfVar4 = std::max<float>(local_58,&local_1c);
      local_58[0] = *pfVar4;
      pfVar4 = std::min<float>(local_88,&local_20);
      local_88[0] = *pfVar4;
      if (local_88[0] <= local_58[0]) {
        local_1 = 0;
        fVar6 = in_stack_fffffffffffffed0;
        goto LAB_00126cd0;
      }
      in_stack_fffffffffffffed4 = local_88[0] - local_58[0];
      Ray::GetDirection((Ray *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      fVar6 = Vec3::length((Vec3 *)0x126ab2);
      in_stack_fffffffffffffed4 = in_stack_fffffffffffffed4 * fVar6;
      Vec3::~Vec3(&local_a8);
      fVar6 = *(float *)(in_RDI + 0x18);
      local_9c = in_stack_fffffffffffffed4;
      auVar9._0_8_ = drand48();
      auVar9._8_8_ = extraout_XMM0_Qb;
      auVar10._4_12_ = auVar9._4_12_;
      auVar10._0_4_ = (float)auVar9._0_8_;
      dVar8 = std::log(auVar10._0_8_);
      fVar6 = (-1.0 / fVar6) * SUB84(dVar8,0);
      local_ac = fVar6;
      if (fVar6 < local_9c) {
        fVar11 = local_58[0];
        Ray::GetDirection((Ray *)CONCAT44(local_58[0],in_stack_fffffffffffffec8));
        fVar7 = Vec3::length((Vec3 *)0x126b94);
        *local_28 = fVar11 + fVar6 / fVar7;
        Vec3::~Vec3(&local_b8);
        Ray::GetPoint((Ray *)CONCAT44(uVar12,fVar5),t);
        local_28[5] = local_c4.e[2];
        *(undefined8 *)(local_28 + 3) = local_c4.e._0_8_;
        Vec3::~Vec3(&local_c4);
        Vec3::Vec3(&local_d0,1.0,0.0,0.0);
        *(undefined8 *)(local_28 + 6) = local_d0.e._0_8_;
        local_28[8] = local_d0.e[2];
        Vec3::~Vec3(&local_d0);
        *(undefined8 *)(local_28 + 10) = *(undefined8 *)(in_RDI + 0x10);
        local_1 = 1;
        goto LAB_00126cd0;
      }
    }
  }
  local_1 = 0;
  fVar6 = in_stack_fffffffffffffed0;
LAB_00126cd0:
  local_98 = 1;
  hit_record_t::~hit_record_t((hit_record_t *)CONCAT44(in_stack_fffffffffffffed4,fVar6));
  hit_record_t::~hit_record_t((hit_record_t *)CONCAT44(in_stack_fffffffffffffed4,fVar6));
  return (bool)(local_1 & 1);
}

Assistant:

bool
Volume::Intersect(const Ray& ray, float t_min, float t_max, hit_record_t& hit_record) const
{
	hit_record_t _hit_record_1, _hit_record_2;
	if(m_object->Intersect(ray, -std::numeric_limits<float>::max(), std::numeric_limits<float>::max(), _hit_record_1) &&
	   m_object->Intersect(ray,     _hit_record_1.m_t + RT_RAY_STEP, std::numeric_limits<float>::max(), _hit_record_2)
	  ) {

		_hit_record_1.m_t = std::max(_hit_record_1.m_t, t_min);
		_hit_record_2.m_t = std::min(_hit_record_2.m_t, t_max);
		if(_hit_record_1.m_t >= _hit_record_2.m_t) {
			return false;
		}

		float _distance_in_object = (_hit_record_2.m_t - _hit_record_1.m_t)*ray.GetDirection().length();
		float _hit_distance		  = -(1.0f / m_density)*std::log(RANDOM_GEN());
		if(_hit_distance < _distance_in_object) {
			hit_record.m_t        = _hit_record_1.m_t + _hit_distance/ray.GetDirection().length();
			hit_record.m_point    = ray.GetPoint(hit_record.m_t);
			hit_record.m_normal   = Vec3(1.0f,0.0f,0.0f);
			hit_record.m_material = m_material;
			return true;
		}
	}

    return false;
}